

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lib.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulp_private_key **unaff_retaddr;
  uint8_t *r_decrypted;
  ulp_ring_ciphertext *r_ciphertext;
  ulp_ring_private_key *r_priv_key;
  ulp_ring_public_key *r_pub_key;
  uint8_t *decrypted;
  ulp_ciphertext *ciphertext;
  uint8_t msg [12];
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  uint64_t q;
  uint64_t se;
  uint64_t sk;
  size_t l;
  size_t n;
  void *local_80;
  uint8_t **in_stack_ffffffffffffff98;
  ulp_ring_private_key *in_stack_ffffffffffffffa0;
  ulp_ring_ciphertext *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulp_public_key **in_stack_ffffffffffffffc0;
  ulp_ciphertext **in_stack_ffffffffffffffc8;
  ulp_public_key *in_stack_ffffffffffffffd0;
  uint64_t *in_stack_ffffffffffffffd8;
  uint64_t *in_stack_ffffffffffffffe0;
  ulong uVar5;
  uint in_stack_fffffffffffffff8;
  
  uVar5 = 0x60;
  ulp_generate_parameters
            ((ulong)in_stack_fffffffffffffff8,0xc0,(uint64_t *)0x60,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  ulp_generate_key_pair
            (uVar5,(size_t)in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8,
             (uint64_t)in_stack_ffffffffffffffd0,(uint64_t)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,unaff_retaddr);
  uVar2 = 0x6c6c6548;
  uVar3 = 0x6f57206f;
  uVar4 = 0x21646c72;
  ulp_encrypt((uint8_t *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
              in_stack_ffffffffffffffc8);
  ulp_decrypt((ulp_ciphertext *)CONCAT44(uVar4,uVar3),
              (ulp_private_key *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
              (uint8_t **)in_stack_ffffffffffffffa8);
  iVar1 = memcmp(&stack0xffffffffffffffb4,in_stack_ffffffffffffffa0,uVar5 >> 3);
  if (iVar1 == 0) {
    uVar5 = 0x60;
    ulp_ring_generate_key_pair
              ((size_t)in_stack_ffffffffffffffc8,(uint64_t)in_stack_ffffffffffffffc0,
               CONCAT44(uVar4,uVar3),CONCAT44(uVar2,in_stack_ffffffffffffffb0),
               (ulp_ring_public_key **)in_stack_ffffffffffffffa8,
               (ulp_ring_private_key **)in_stack_ffffffffffffffa0);
    ulp_ring_encrypt((uint8_t *)CONCAT44(uVar4,uVar3),
                     (ulp_ring_public_key *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     (ulp_ring_ciphertext **)in_stack_ffffffffffffffa8);
    ulp_ring_decrypt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    iVar1 = memcmp(&stack0xffffffffffffffb4,local_80,uVar5 >> 3);
    if (iVar1 == 0) {
      ulp_free_public_key((ulp_public_key *)0x10135c);
      ulp_free_private_key((ulp_private_key *)0x101366);
      ulp_free_ciphertext((ulp_ciphertext *)0x101370);
      free(in_stack_ffffffffffffffa0);
      ulp_ring_free_public_key((ulp_ring_public_key *)0x101384);
      ulp_ring_free_private_key((ulp_ring_private_key *)0x10138e);
      ulp_ring_free_ciphertext((ulp_ring_ciphertext *)0x101398);
      free(local_80);
      return 0;
    }
  }
  ulp_free_public_key((ulp_public_key *)0x1013b9);
  ulp_free_private_key((ulp_private_key *)0x1013c3);
  ulp_free_ciphertext((ulp_ciphertext *)0x1013cd);
  free(in_stack_ffffffffffffffa0);
  ulp_ring_free_public_key((ulp_ring_public_key *)0x1013e1);
  ulp_ring_free_private_key((ulp_ring_private_key *)0x1013eb);
  ulp_ring_free_ciphertext((ulp_ring_ciphertext *)0x1013f5);
  free(local_80);
  return 1;
}

Assistant:

int main() {

    // test U-LP functions for normal variant

    size_t n = 192;
    size_t l = 96;
    uint64_t sk;
    uint64_t se;
    uint64_t q;

    ulp_generate_parameters(n, l, &sk, &se, &q);

    ulp_public_key* pub_key;
    ulp_private_key* priv_key;
    ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key);

    uint8_t msg[] = {'H', 'e', 'l', 'l', 'o', ' ', 'W', 'o', 'r', 'l', 'd', '!'};

    ulp_ciphertext* ciphertext;
    ulp_encrypt(msg, pub_key, &ciphertext);

    uint8_t* decrypted;
    ulp_decrypt(ciphertext, priv_key, &decrypted);

    if(memcmp(msg, decrypted, l/8) != 0)
        goto error;


    // test U-LP functions for ring variant

    n = 96;
    sk = 34419;
    se = 5409067;
    q = 468128092967831;

    ulp_ring_public_key* r_pub_key;
    ulp_ring_private_key* r_priv_key;
    ulp_ring_generate_key_pair(n, sk, se, q, &r_pub_key, &r_priv_key);

    ulp_ring_ciphertext* r_ciphertext;
    ulp_ring_encrypt(msg, r_pub_key, &r_ciphertext);

    uint8_t* r_decrypted;
    ulp_ring_decrypt(r_ciphertext, r_priv_key, &r_decrypted);

    if(memcmp(msg, r_decrypted, n/8) != 0)
        goto error;


    // do cleanup

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    ulp_free_ciphertext(ciphertext);
    free(decrypted);
    ulp_ring_free_public_key(r_pub_key);
    ulp_ring_free_private_key(r_priv_key);
    ulp_ring_free_ciphertext(r_ciphertext);
    free(r_decrypted);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        ulp_free_ciphertext(ciphertext);
        free(decrypted);
        ulp_ring_free_public_key(r_pub_key);
        ulp_ring_free_private_key(r_priv_key);
        ulp_ring_free_ciphertext(r_ciphertext);
        free(r_decrypted);
        return 1;

}